

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filekeyvaluestore.cpp
# Opt level: O2

void __thiscall
groundupdbext::FileKeyValueStore::setKeyValue
          (FileKeyValueStore *this,HashedValue *key,EncodedValue *value)

{
  HashedValue *this_00;
  size_t __val;
  ostream *poVar1;
  byte *b;
  _Alloc_hider _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string keyHash;
  ofstream os;
  
  std::ofstream::ofstream(&os);
  __val = groundupdb::HashedValue::hash(key);
  std::__cxx11::to_string(&keyHash,__val);
  std::operator+(&local_290,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (this->mImpl)._M_t.
                 super___uniq_ptr_impl<groundupdbext::FileKeyValueStore::Impl,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
                 .super__Head_base<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_false>.
                 _M_head_impl,"/");
  std::operator+(&local_270,&local_290,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keyHash);
  std::operator+(&local_2b0,&local_270,".kv");
  std::ofstream::open((string *)&os,(_Ios_Openmode)&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(&os,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = groundupdb::operator<<((ostream *)&os,value->m_type);
  std::endl<char,std::char_traits<char>>(poVar1);
  this_00 = &value->m_value;
  groundupdb::HashedValue::length(this_00);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&os);
  std::endl<char,std::char_traits<char>>(poVar1);
  groundupdb::HashedValue::data((Bytes *)&local_2b0,this_00);
  for (_Var2._M_p = local_2b0._M_dataplus._M_p; _Var2._M_p != (pointer)local_2b0._M_string_length;
      _Var2._M_p = _Var2._M_p + 1) {
    std::operator<<((ostream *)&os,*_Var2._M_p);
  }
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&local_2b0);
  std::endl<char,std::char_traits<char>>((ostream *)&os);
  groundupdb::HashedValue::hash(this_00);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&os);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ofstream::close();
  std::operator+(&local_290,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (this->mImpl)._M_t.
                 super___uniq_ptr_impl<groundupdbext::FileKeyValueStore::Impl,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
                 .super__Head_base<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_false>.
                 _M_head_impl,"/");
  std::operator+(&local_270,&local_290,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keyHash);
  std::operator+(&local_2b0,&local_270,".key");
  std::ofstream::open((string *)&os,(_Ios_Openmode)&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  poVar1 = groundupdb::operator<<((ostream *)&os,value->m_type);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&os,keyHash._M_dataplus._M_p);
  std::ofstream::close();
  std::__cxx11::string::~string((string *)&keyHash);
  std::ofstream::~ofstream(&os);
  return;
}

Assistant:

void
FileKeyValueStore::setKeyValue(const HashedValue& key,EncodedValue&& value)
{
  std::ofstream os;
  std::string keyHash(std::to_string(key.hash()));
  os.open(mImpl->m_fullpath + "/" + keyHash + ".kv",
          std::ios::out | std::ios::trunc);
  os << value.hasValue() << std::endl;
  os << value.type() << std::endl;
  os << value.length() << std::endl;
  for (auto& b : value.data()) {
    os << (const char)b;
  }
  os << std::endl;
  os << value.hash() << std::endl;
  os.close();
  // TODO allow multiple keys for this hash (read, modify, write)
  os.open(mImpl->m_fullpath + "/" + keyHash + ".key",
          std::ios::out | std::ios::trunc);
  os << value.type() << std::endl;
  os << keyHash.c_str();
  os.close();
}